

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsmJsTypes.cpp
# Opt level: O0

AsmJsVarBase * __thiscall
Js::AsmJsFunc::DefineVar(AsmJsFunc *this,PropertyName name,bool isArg,bool isMutable)

{
  code *pcVar1;
  bool bVar2;
  LPCOLESTR pOVar3;
  undefined4 *puVar4;
  ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *pAVar5;
  AsmJsFunc *pAVar6;
  size_t byteSize;
  PropertyId local_a8;
  int local_a4;
  code *pcStack_a0;
  int addResult;
  undefined8 local_98;
  TrackAllocData local_90;
  code *local_68;
  undefined8 local_60;
  TrackAllocData local_58;
  AsmJsFunc *local_30;
  AsmJsVarBase *var;
  bool isMutable_local;
  PropertyName pIStack_20;
  bool isArg_local;
  PropertyName name_local;
  AsmJsFunc *this_local;
  
  var._6_1_ = isMutable;
  var._7_1_ = isArg;
  pIStack_20 = name;
  name_local = (PropertyName)this;
  local_30 = (AsmJsFunc *)FindVar(this,name);
  if (local_30 == (AsmJsFunc *)0x0) {
    if ((var._7_1_ & 1) == 0) {
      pAVar5 = &((this->super_AsmJsFunctionDeclaration).mAllocator)->
                super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>;
      Memory::TrackAllocData::CreateTrackAllocData
                (&local_90,(type_info *)&AsmJsVar::typeinfo,0,0xffffffffffffffff,
                 "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/AsmJsTypes.cpp"
                 ,0x2f4);
      pAVar5 = Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
               TrackAllocInfo(pAVar5,&local_90);
      pcStack_a0 = Memory::ArenaAllocator::Alloc;
      local_98 = 0;
      pAVar6 = (AsmJsFunc *)new<Memory::ArenaAllocator>(0x28,(ArenaAllocator *)pAVar5,0x3f67b0);
      AsmJsVar::AsmJsVar((AsmJsVar *)pAVar6,pIStack_20,(bool)(var._6_1_ & 1));
      local_30 = pAVar6;
    }
    else {
      if ((var._6_1_ & 1) == 0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar4 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/AsmJsTypes.cpp"
                                    ,0x2ef,"(isMutable)","isMutable");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar4 = 0;
      }
      pAVar5 = &((this->super_AsmJsFunctionDeclaration).mAllocator)->
                super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>;
      Memory::TrackAllocData::CreateTrackAllocData
                (&local_58,(type_info *)&AsmJsArgument::typeinfo,0,0xffffffffffffffff,
                 "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/AsmJsTypes.cpp"
                 ,0x2f0);
      pAVar5 = Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
               TrackAllocInfo(pAVar5,&local_58);
      local_68 = Memory::ArenaAllocator::Alloc;
      local_60 = 0;
      pAVar6 = (AsmJsFunc *)new<Memory::ArenaAllocator>(0x20,(ArenaAllocator *)pAVar5,0x3f67b0);
      AsmJsArgument::AsmJsArgument((AsmJsArgument *)pAVar6,pIStack_20);
      local_30 = pAVar6;
    }
    local_a8 = Ident::GetPropertyId(pIStack_20);
    local_a4 = JsUtil::
               BaseDictionary<int,_Js::AsmJsVarBase_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
               ::AddNew(&this->mVarMap,&local_a8,(AsmJsVarBase **)&local_30);
    if (local_a4 == -1) {
      byteSize = 0x28;
      if ((var._7_1_ & 1) != 0) {
        byteSize = 0x20;
      }
      Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::Free
                (&((this->super_AsmJsFunctionDeclaration).mAllocator)->
                  super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>,local_30,
                 byteSize);
      this_local = (AsmJsFunc *)0x0;
    }
    else {
      this_local = local_30;
    }
  }
  else {
    bVar2 = Phases::IsEnabled((Phases *)&DAT_01ec1678,AsmjsPhase);
    if (bVar2) {
      pOVar3 = Ident::Psz(pIStack_20);
      Output::Print(L"Variable redefinition: %s\n",pOVar3);
    }
    this_local = (AsmJsFunc *)0x0;
  }
  return (AsmJsVarBase *)this_local;
}

Assistant:

AsmJsVarBase* AsmJsFunc::DefineVar( PropertyName name, bool isArg /*= false*/, bool isMutable /*= true*/ )
    {
        AsmJsVarBase* var = FindVar(name);
        if (var)
        {
            if (PHASE_TRACE1(AsmjsPhase))
            {
                Output::Print(_u("Variable redefinition: %s\n"), name->Psz());
            }
            return nullptr;
        }

        if (isArg)
        {
            // arg cannot be const
            Assert(isMutable);
            var = Anew( mAllocator, AsmJsArgument, name );
        }
        else
        {
            var = Anew(mAllocator, AsmJsVar, name, isMutable);
        }
        int addResult = mVarMap.AddNew(name->GetPropertyId(), var);
        if( addResult == -1 )
        {
            mAllocator->Free(var, isArg ? sizeof(AsmJsArgument) : sizeof(AsmJsVar));
            return nullptr;
        }
        return var;
    }